

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O3

block_state deflate_rle(deflate_state *s,int flush)

{
  long lVar1;
  Bytef BVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  Bytef *pBVar11;
  long lVar12;
  
LAB_0077ae56:
  do {
    uVar7 = s->lookahead;
    if (uVar7 < 0x103) {
      fill_window(s);
      uVar7 = s->lookahead;
      if (flush == 0 && uVar7 < 0x103) {
        return need_more;
      }
      if (uVar7 == 0) {
        s->insert = 0;
        if (flush == 4) {
          uVar3 = s->block_start;
          if ((long)uVar3 < 0) {
            pBVar11 = (Bytef *)0x0;
          }
          else {
            pBVar11 = s->window + (uVar3 & 0xffffffff);
          }
          cm_zlib__tr_flush_block(s,(charf *)pBVar11,s->strstart - uVar3,1);
          s->block_start = (ulong)s->strstart;
          flush_pending(s->strm);
          return finish_done - (s->strm->avail_out == 0);
        }
        if (s->sym_next != 0) {
          uVar3 = s->block_start;
          if ((long)uVar3 < 0) {
            pBVar11 = (Bytef *)0x0;
          }
          else {
            pBVar11 = s->window + (uVar3 & 0xffffffff);
          }
          cm_zlib__tr_flush_block(s,(charf *)pBVar11,s->strstart - uVar3,0);
          s->block_start = (ulong)s->strstart;
          flush_pending(s->strm);
          if (s->strm->avail_out == 0) {
            return need_more;
          }
        }
        return block_done;
      }
      s->match_length = 0;
      uVar6 = s->strstart;
      if (2 < uVar7) goto LAB_0077aebc;
LAB_0077af6a:
      uVar7 = s->sym_next;
LAB_0077af70:
      bVar8 = s->window[uVar6];
      s->sym_next = uVar7 + 1;
      s->sym_buf[uVar7] = '\0';
      uVar7 = s->sym_next;
      s->sym_next = uVar7 + 1;
      s->sym_buf[uVar7] = '\0';
      uVar7 = s->sym_next;
      s->sym_next = uVar7 + 1;
      s->sym_buf[uVar7] = bVar8;
      s->dyn_ltree[bVar8].fc.freq = s->dyn_ltree[bVar8].fc.freq + 1;
      s->lookahead = s->lookahead - 1;
      uVar7 = s->strstart + 1;
      s->strstart = uVar7;
      if (s->sym_next != s->sym_end) goto LAB_0077ae56;
    }
    else {
      s->match_length = 0;
      uVar6 = s->strstart;
LAB_0077aebc:
      if (uVar6 == 0) goto LAB_0077af6a;
      pBVar11 = s->window;
      BVar2 = pBVar11[(ulong)uVar6 - 1];
      if (((BVar2 != pBVar11[uVar6]) || (pBVar11 = pBVar11 + uVar6, BVar2 != pBVar11[1])) ||
         (BVar2 != pBVar11[2])) goto LAB_0077af6a;
      iVar4 = (int)pBVar11;
      lVar12 = 0;
      do {
        iVar9 = (int)lVar12;
        if (BVar2 != pBVar11[lVar12 + 3]) {
          iVar9 = iVar4 + iVar9 + 3;
          goto LAB_0077b07d;
        }
        if (BVar2 != pBVar11[lVar12 + 4]) {
          iVar9 = iVar4 + iVar9 + 4;
          goto LAB_0077b07d;
        }
        if (BVar2 != pBVar11[lVar12 + 5]) {
          iVar9 = iVar4 + iVar9 + 5;
          goto LAB_0077b07d;
        }
        if (BVar2 != pBVar11[lVar12 + 6]) {
          iVar9 = iVar4 + iVar9 + 6;
          goto LAB_0077b07d;
        }
        if (BVar2 != pBVar11[lVar12 + 7]) {
          iVar9 = iVar4 + iVar9 + 7;
          goto LAB_0077b07d;
        }
        if (BVar2 != pBVar11[lVar12 + 8]) {
          iVar9 = iVar4 + iVar9 + 8;
          goto LAB_0077b07d;
        }
        if (BVar2 != pBVar11[lVar12 + 9]) {
          iVar9 = iVar4 + iVar9 + 9;
          goto LAB_0077b07d;
        }
        lVar1 = lVar12 + 8;
      } while ((lVar12 + 2U < 0xfa) &&
              (lVar5 = lVar12 + 10, lVar12 = lVar1, BVar2 == pBVar11[lVar5]));
      iVar9 = iVar4 + (int)lVar1 + 2;
LAB_0077b07d:
      uVar10 = (iVar9 - (iVar4 + 0x102)) + 0x102;
      if (uVar7 <= uVar10) {
        uVar10 = uVar7;
      }
      s->match_length = uVar10;
      uVar7 = s->sym_next;
      if (uVar10 < 3) goto LAB_0077af70;
      bVar8 = (char)uVar10 - 3;
      s->sym_next = uVar7 + 1;
      s->sym_buf[uVar7] = '\x01';
      uVar7 = s->sym_next;
      s->sym_next = uVar7 + 1;
      s->sym_buf[uVar7] = '\0';
      uVar7 = s->sym_next;
      s->sym_next = uVar7 + 1;
      s->sym_buf[uVar7] = bVar8;
      s->dyn_ltree[(ulong)""[bVar8] + 0x101].fc.freq =
           s->dyn_ltree[(ulong)""[bVar8] + 0x101].fc.freq + 1;
      s->dyn_dtree[0].fc.freq = s->dyn_dtree[0].fc.freq + 1;
      s->lookahead = s->lookahead - s->match_length;
      uVar7 = s->match_length + s->strstart;
      s->strstart = uVar7;
      s->match_length = 0;
      if (s->sym_next != s->sym_end) goto LAB_0077ae56;
    }
    uVar3 = s->block_start;
    if ((long)uVar3 < 0) {
      pBVar11 = (Bytef *)0x0;
    }
    else {
      pBVar11 = s->window + (uVar3 & 0xffffffff);
    }
    cm_zlib__tr_flush_block(s,(charf *)pBVar11,uVar7 - uVar3,0);
    s->block_start = (ulong)s->strstart;
    flush_pending(s->strm);
    if (s->strm->avail_out == 0) {
      return need_more;
    }
  } while( true );
}

Assistant:

local block_state deflate_rle(deflate_state *s, int flush) {
    int bflush;             /* set if current block must be flushed */
    uInt prev;              /* byte at distance one to match */
    Bytef *scan, *strend;   /* scan goes up to strend for length of run */

    for (;;) {
        /* Make sure that we always have enough lookahead, except
         * at the end of the input file. We need MAX_MATCH bytes
         * for the longest run, plus one for the unrolled loop.
         */
        if (s->lookahead <= MAX_MATCH) {
            fill_window(s);
            if (s->lookahead <= MAX_MATCH && flush == Z_NO_FLUSH) {
                return need_more;
            }
            if (s->lookahead == 0) break; /* flush the current block */
        }

        /* See how many times the previous byte repeats */
        s->match_length = 0;
        if (s->lookahead >= MIN_MATCH && s->strstart > 0) {
            scan = s->window + s->strstart - 1;
            prev = *scan;
            if (prev == *++scan && prev == *++scan && prev == *++scan) {
                strend = s->window + s->strstart + MAX_MATCH;
                do {
                } while (prev == *++scan && prev == *++scan &&
                         prev == *++scan && prev == *++scan &&
                         prev == *++scan && prev == *++scan &&
                         prev == *++scan && prev == *++scan &&
                         scan < strend);
                s->match_length = MAX_MATCH - (uInt)(strend - scan);
                if (s->match_length > s->lookahead)
                    s->match_length = s->lookahead;
            }
            Assert(scan <= s->window + (uInt)(s->window_size - 1),
                   "wild scan");
        }

        /* Emit match if have run of MIN_MATCH or longer, else emit literal */
        if (s->match_length >= MIN_MATCH) {
            check_match(s, s->strstart, s->strstart - 1, s->match_length);

            _tr_tally_dist(s, 1, s->match_length - MIN_MATCH, bflush);

            s->lookahead -= s->match_length;
            s->strstart += s->match_length;
            s->match_length = 0;
        } else {
            /* No match, output a literal byte */
            Tracevv((stderr,"%c", s->window[s->strstart]));
            _tr_tally_lit(s, s->window[s->strstart], bflush);
            s->lookahead--;
            s->strstart++;
        }
        if (bflush) FLUSH_BLOCK(s, 0);
    }
    s->insert = 0;
    if (flush == Z_FINISH) {
        FLUSH_BLOCK(s, 1);
        return finish_done;
    }
    if (s->sym_next)
        FLUSH_BLOCK(s, 0);
    return block_done;
}